

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saa1099_vb.c
# Opt level: O1

void saa_envgen_step(SAA_ENV_GEN *saaEGen)

{
  byte bVar1;
  byte bVar2;
  
  if (saaEGen->enable != '\0') {
    bVar1 = saa_envelopes[saaEGen->wave][saaEGen->pos];
    saaEGen->flags = bVar1 & 0xf0;
    bVar2 = bVar1 & 0xf;
    saaEGen->volR = bVar2;
    saaEGen->volL = bVar2;
    if (saaEGen->invert != '\0') {
      saaEGen->volR = bVar2 ^ 0xf;
    }
    if ((bVar1 & 0x40) == 0) {
      saaEGen->pos = saaEGen->pos + 1 & 0x1f;
    }
    if (saaEGen->step != '\0') {
      bVar2 = saa_envelopes[saaEGen->wave][saaEGen->pos] | bVar1;
      saaEGen->flags = bVar2 & 0xf0;
      saaEGen->volL = bVar1 & 0xe;
      saaEGen->volR = saaEGen->volR & 0xfe;
      if ((bVar2 & 0x40) == 0) {
        saaEGen->pos = saaEGen->pos + 1 & 0x1f;
      }
    }
  }
  return;
}

Assistant:

static void saa_envgen_step(SAA_ENV_GEN* saaEGen)
{
	UINT8 wdata;
	
	if (! saaEGen->enable)
		return;
	
	wdata = saa_envelopes[saaEGen->wave][saaEGen->pos];
	saaEGen->flags = wdata & 0xF0;
	saaEGen->volL = saaEGen->volR = wdata & 0x0F;
	if (saaEGen->invert)
		saaEGen->volR ^= 0x0F;
	
	if (! (saaEGen->flags & ENV_STAY))
	{
		saaEGen->pos ++;
		saaEGen->pos &= 0x1F;
	}
	if (saaEGen->step)
	{
		saaEGen->flags |= (saa_envelopes[saaEGen->wave][saaEGen->pos] & 0xF0);
		saaEGen->volL &= ~0x01;
		saaEGen->volR &= ~0x01;
		if (! (saaEGen->flags & ENV_STAY))
		{
			saaEGen->pos ++;
			saaEGen->pos &= 0x1F;
		}
	}
	
	return;
}